

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_stcke(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *pTVar1;
  TCGv_i64 pTVar2;
  uint uVar3;
  TCGTemp *ret;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i64 ret_00;
  TCGv_i64 arg1;
  TCGTemp *local_38;
  
  pTVar1 = s->uc->tcg_ctx;
  ret = tcg_temp_new_internal_s390x(pTVar1,TCG_TYPE_I64,false);
  arg1 = (TCGv_i64)((long)ret - (long)pTVar1);
  ts = tcg_temp_new_internal_s390x(pTVar1,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)ts - (long)pTVar1);
  ts_00 = tcg_temp_new_internal_s390x(pTVar1,TCG_TYPE_I64,false);
  local_38 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
  tcg_gen_callN_s390x(pTVar1,helper_stck,ret,1,&local_38);
  tcg_gen_op3_s390x(pTVar1,INDEX_op_ld32u_i64,(TCGArg)ts_00,(TCGArg)(pTVar1->cpu_env + (long)pTVar1)
                    ,0x400);
  tcg_gen_shli_i64_s390x(pTVar1,ret_00,arg1,0x38);
  tcg_gen_shri_i64_s390x(pTVar1,arg1,arg1,8);
  tcg_gen_ori_i64_s390x(pTVar1,ret_00,ret_00,0x10000);
  tcg_gen_op3_s390x(pTVar1,INDEX_op_or_i64,(TCGArg)ts,(TCGArg)ts,(TCGArg)ts_00);
  pTVar2 = o->in2;
  uVar3 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
  tcg_gen_qemu_st_i64_s390x(pTVar1,arg1,pTVar2,(ulong)uVar3,MO_BEQ);
  tcg_gen_addi_i64_s390x(pTVar1,o->in2,o->in2,8);
  pTVar2 = o->in2;
  uVar3 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
  tcg_gen_qemu_st_i64_s390x(pTVar1,ret_00,pTVar2,(ulong)uVar3,MO_BEQ);
  tcg_temp_free_internal_s390x(pTVar1,ret);
  tcg_temp_free_internal_s390x(pTVar1,ts);
  tcg_temp_free_internal_s390x(pTVar1,ts_00);
  if (CC_OP_STATIC < s->cc_op) {
    pTVar1 = s->uc->tcg_ctx;
    tcg_gen_op1_s390x(pTVar1,INDEX_op_discard,(TCGArg)(pTVar1->cc_src + (long)pTVar1));
    tcg_gen_op1_s390x(pTVar1,INDEX_op_discard,(TCGArg)(pTVar1->cc_dst + (long)pTVar1));
    tcg_gen_op1_s390x(pTVar1,INDEX_op_discard,(TCGArg)(pTVar1->cc_vr + (long)pTVar1));
  }
  s->cc_op = CC_OP_CONST0;
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_stcke(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 c1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 c2 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 todpr = tcg_temp_new_i64(tcg_ctx);
    gen_helper_stck(tcg_ctx, c1, tcg_ctx->cpu_env);
    /* 16 bit value store in an uint32_t (only valid bits set) */
    tcg_gen_ld32u_i64(tcg_ctx, todpr, tcg_ctx->cpu_env, offsetof(CPUS390XState, todpr));
    /* Shift the 64-bit value into its place as a zero-extended
       104-bit value.  Note that "bit positions 64-103 are always
       non-zero so that they compare differently to STCK"; we set
       the least significant bit to 1.  */
    tcg_gen_shli_i64(tcg_ctx, c2, c1, 56);
    tcg_gen_shri_i64(tcg_ctx, c1, c1, 8);
    tcg_gen_ori_i64(tcg_ctx, c2, c2, 0x10000);
    tcg_gen_or_i64(tcg_ctx, c2, c2, todpr);
    tcg_gen_qemu_st64(tcg_ctx, c1, o->in2, get_mem_index(s));
    tcg_gen_addi_i64(tcg_ctx, o->in2, o->in2, 8);
    tcg_gen_qemu_st64(tcg_ctx, c2, o->in2, get_mem_index(s));
    tcg_temp_free_i64(tcg_ctx, c1);
    tcg_temp_free_i64(tcg_ctx, c2);
    tcg_temp_free_i64(tcg_ctx, todpr);
    /* ??? We don't implement clock states.  */
    gen_op_movi_cc(s, 0);
    return DISAS_NEXT;
}